

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btMultiBodyDynamicsWorld::updateActivationState(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  btMultiBody *this_00;
  btCollisionObject *pbVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  CProfileManager::Start_Profile("btMultiBodyDynamicsWorld::updateActivationState");
  if (0 < (this->m_multiBodies).m_size) {
    lVar3 = 0;
    do {
      this_00 = (this->m_multiBodies).m_data[lVar3];
      if (this_00 != (btMultiBody *)0x0) {
        btMultiBody::checkMotionAndSleepIfRequired(this_00,timeStep);
        pbVar1 = (btCollisionObject *)this_00->m_baseCollider;
        if (this_00->m_awake == false) {
          if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 == 1)) {
            btCollisionObject::setActivationState(pbVar1,3);
            pbVar1->m_deactivationTime = 0.0;
          }
          iVar2 = (this_00->m_links).m_size;
          if (0 < iVar2) {
            lVar5 = 0x1e8;
            lVar4 = 0;
            do {
              pbVar1 = *(btCollisionObject **)
                        ((long)(((this_00->m_links).m_data)->m_inertiaLocal).m_floats + lVar5 + -4);
              if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 == 1)) {
                btCollisionObject::setActivationState(pbVar1,3);
                pbVar1->m_deactivationTime = 0.0;
                iVar2 = (this_00->m_links).m_size;
              }
              lVar4 = lVar4 + 1;
              lVar5 = lVar5 + 600;
            } while (lVar4 < iVar2);
          }
        }
        else {
          if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 != 4)) {
            btCollisionObject::setActivationState(pbVar1,1);
          }
          iVar2 = (this_00->m_links).m_size;
          if (0 < iVar2) {
            lVar5 = 0x1e8;
            lVar4 = 0;
            do {
              pbVar1 = *(btCollisionObject **)
                        ((long)(((this_00->m_links).m_data)->m_inertiaLocal).m_floats + lVar5 + -4);
              if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 != 4)) {
                btCollisionObject::setActivationState(pbVar1,1);
                iVar2 = (this_00->m_links).m_size;
              }
              lVar4 = lVar4 + 1;
              lVar5 = lVar5 + 600;
            } while (lVar4 < iVar2);
          }
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->m_multiBodies).m_size);
  }
  btDiscreteDynamicsWorld::updateActivationState(&this->super_btDiscreteDynamicsWorld,timeStep);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::updateActivationState(btScalar timeStep)
{
	BT_PROFILE("btMultiBodyDynamicsWorld::updateActivationState");

	
	
	for ( int i=0;i<m_multiBodies.size();i++)
	{
		btMultiBody* body = m_multiBodies[i];
		if (body)
		{
			body->checkMotionAndSleepIfRequired(timeStep);
			if (!body->isAwake())
			{
				btMultiBodyLinkCollider* col = body->getBaseCollider();
				if (col && col->getActivationState() == ACTIVE_TAG)
				{
					col->setActivationState( WANTS_DEACTIVATION);
					col->setDeactivationTime(0.f);
				}
				for (int b=0;b<body->getNumLinks();b++)
				{
					btMultiBodyLinkCollider* col = body->getLink(b).m_collider;
					if (col && col->getActivationState() == ACTIVE_TAG)
					{
						col->setActivationState( WANTS_DEACTIVATION);
						col->setDeactivationTime(0.f);
					}
				}
			} else
			{
				btMultiBodyLinkCollider* col = body->getBaseCollider();
				if (col && col->getActivationState() != DISABLE_DEACTIVATION)
					col->setActivationState( ACTIVE_TAG );

				for (int b=0;b<body->getNumLinks();b++)
				{
					btMultiBodyLinkCollider* col = body->getLink(b).m_collider;
					if (col && col->getActivationState() != DISABLE_DEACTIVATION)
						col->setActivationState( ACTIVE_TAG );
				}
			}

		}
	}

	btDiscreteDynamicsWorld::updateActivationState(timeStep);
}